

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O0

TPZAutoPointer<TPZMatrix<double>_> __thiscall
TPZSTShiftOrigin<double>::CalcMatrix
          (TPZSTShiftOrigin<double> *this,TPZAutoPointer<TPZMatrix<double>_> *A,
          TPZAutoPointer<TPZMatrix<double>_> *B)

{
  int iVar1;
  TPZMatrix<double> *pTVar2;
  TPZBaseMatrix *this_00;
  long lVar3;
  TPZMatrix<double> *pTVar4;
  TPZAutoPointer<TPZMatrix<double>_> *in_RCX;
  TPZAutoPointer<TPZMatrix<double>_> *in_RDX;
  TPZSTShiftOrigin<double> *in_RSI;
  TPZReference *in_RDI;
  double extraout_XMM0_Qa;
  int i;
  int64_t nRows;
  double *shift;
  TPZAutoPointer<TPZMatrix<double>_> *shiftedMat;
  TPZAutoPointer<TPZMatrix<double>_> *in_stack_ffffffffffffff48;
  TPZAutoPointer<TPZMatrix<double>_> *in_stack_ffffffffffffff50;
  long lVar5;
  double local_58;
  int local_50;
  long local_40;
  double local_38;
  double *local_30;
  undefined1 local_21;
  
  pTVar2 = TPZAutoPointer<TPZMatrix<double>_>::operator->(in_RCX);
  iVar1 = (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  if (iVar1 == 0) {
    pTVar2 = TPZAutoPointer<TPZMatrix<double>_>::operator->(in_RCX);
    (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x17])();
  }
  else {
    pTVar2 = TPZAutoPointer<TPZMatrix<double>_>::operator->(in_RCX);
    (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1b])();
  }
  local_21 = 0;
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  local_38 = Shift(in_RSI);
  local_30 = &local_38;
  this_00 = &TPZAutoPointer<TPZMatrix<double>_>::operator->(in_RDX)->super_TPZBaseMatrix;
  local_40 = TPZBaseMatrix::Rows(this_00);
  for (local_50 = 0; local_50 < local_40; local_50 = local_50 + 1) {
    pTVar2 = TPZAutoPointer<TPZMatrix<double>_>::operator->
                       ((TPZAutoPointer<TPZMatrix<double>_> *)in_RDI);
    lVar3 = (long)local_50;
    lVar5 = lVar3;
    pTVar4 = TPZAutoPointer<TPZMatrix<double>_>::operator->
                       ((TPZAutoPointer<TPZMatrix<double>_> *)in_RDI);
    (*(pTVar4->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(pTVar4,(long)local_50);
    local_58 = extraout_XMM0_Qa - *local_30;
    (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
              (pTVar2,lVar5,lVar3,&local_58);
  }
  return (TPZAutoPointer<TPZMatrix<double>_>)in_RDI;
}

Assistant:

TPZAutoPointer<TPZMatrix<TVar>>
TPZSTShiftOrigin<TVar>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>A, TPZAutoPointer<TPZMatrix<TVar>>B) const
{
  if (B->IsSymmetric()) B->Decompose_LDLt();
  else B->Decompose_LU();
  TPZAutoPointer<TPZMatrix<TVar>> shiftedMat = A;
  //b-1 * shiftedA will be computed at the arnoldi iteration
  const auto &shift = Shift();
  const auto nRows = A->Rows();
  for(int i = 0; i < nRows; i++) shiftedMat->PutVal(i,i,shiftedMat->GetVal(i,i)-shift);
  return shiftedMat;
}